

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

void __thiscall
FIX::SocketMonitor::processWrite(SocketMonitor *this,Strategy *strategy,socket_handle socket_fd)

{
  iterator iVar1;
  long lStack_30;
  socket_handle s;
  
  iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_connectSockets)._M_t,&s);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header) {
    lStack_30 = 0x20;
  }
  else {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(this->m_connectSockets)._M_t,&s);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->m_readSockets,&s);
    lStack_30 = 0x10;
  }
  (**(code **)((long)strategy->_vptr_Strategy + lStack_30))(strategy,this,socket_fd);
  return;
}

Assistant:

void SocketMonitor::processWrite(Strategy &strategy, socket_handle socket_fd) {
  socket_handle s = socket_fd;
  if (m_connectSockets.find(s) != m_connectSockets.end()) {
    m_connectSockets.erase(s);
    m_readSockets.insert(s);
    strategy.onConnect(*this, s);
  } else {
    strategy.onWrite(*this, s);
  }
}